

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O0

void lh_maybe_resize(_LHASH *lh)

{
  ulong uVar1;
  size_t local_28;
  size_t new_num_buckets_1;
  size_t new_num_buckets;
  size_t avg_chain_length;
  _LHASH *lh_local;
  
  if (lh->callback_depth == 0) {
    if (lh->num_buckets < 0x10) {
      __assert_fail("lh->num_buckets >= kMinNumBuckets",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash.cc"
                    ,0xc9,"void lh_maybe_resize(_LHASH *)");
    }
    uVar1 = lh->num_items / lh->num_buckets;
    if (uVar1 < 3) {
      if ((uVar1 == 0) && (0x10 < lh->num_buckets)) {
        local_28 = lh->num_buckets >> 1;
        if (local_28 < 0x10) {
          local_28 = 0x10;
        }
        lh_rebucket(lh,local_28);
      }
    }
    else {
      uVar1 = lh->num_buckets << 1;
      if (lh->num_buckets < uVar1) {
        lh_rebucket(lh,uVar1);
      }
    }
  }
  return;
}

Assistant:

static void lh_maybe_resize(_LHASH *lh) {
  size_t avg_chain_length;

  if (lh->callback_depth > 0) {
    // Don't resize the hash if we are currently iterating over it.
    return;
  }

  assert(lh->num_buckets >= kMinNumBuckets);
  avg_chain_length = lh->num_items / lh->num_buckets;

  if (avg_chain_length > kMaxAverageChainLength) {
    const size_t new_num_buckets = lh->num_buckets * 2;

    if (new_num_buckets > lh->num_buckets) {
      lh_rebucket(lh, new_num_buckets);
    }
  } else if (avg_chain_length < kMinAverageChainLength &&
             lh->num_buckets > kMinNumBuckets) {
    size_t new_num_buckets = lh->num_buckets / 2;

    if (new_num_buckets < kMinNumBuckets) {
      new_num_buckets = kMinNumBuckets;
    }

    lh_rebucket(lh, new_num_buckets);
  }
}